

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_getv(comex_giov_t *iov,int iov_len,int proc,comex_group_t group)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int count;
  int bytes;
  void **dst;
  void **src;
  int j;
  int i;
  comex_group_t group_00;
  undefined8 uVar2;
  void *dst_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
    dst_00 = *(void **)(in_RDI + (long)local_18 * 0x18);
    uVar2 = *(undefined8 *)(in_RDI + (long)local_18 * 0x18 + 8);
    group_00 = *(comex_group_t *)(in_RDI + (long)local_18 * 0x18 + 0x14);
    iVar1 = *(int *)(in_RDI + (long)local_18 * 0x18 + 0x10);
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      comex_get((void *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),dst_00,(int)((ulong)uVar2 >> 0x20)
                ,(int)uVar2,group_00);
    }
  }
  return 0;
}

Assistant:

int comex_getv(
        comex_giov_t *iov, int iov_len,
        int proc, comex_group_t group)
{
    int i;
    for (i=0; i<iov_len; ++i) {
        int j;
        void **src = iov[i].src;
        void **dst = iov[i].dst;
        int bytes = iov[i].bytes;
        int count = iov[i].count;
        for (j=0; j<count; ++j) {
            comex_get(src[j], dst[j], bytes, proc, group);
        }
    }
    return COMEX_SUCCESS;
}